

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O0

void fsnav_free_gnss_bds(fsnav_gnss_bds *bds)

{
  fsnav_gnss_bds *bds_local;
  
  if (bds != (fsnav_gnss_bds *)0x0) {
    bds->cfg = (char *)0x0;
    bds->cfglength = 0;
    fsnav_free_gnss_sat(&bds->sat,bds->max_sat_count);
    bds->max_sat_count = 0;
    fsnav_free_null(&bds->obs_types);
    bds->obs_count = 0;
    free(bds);
  }
  return;
}

Assistant:

void fsnav_free_gnss_bds(fsnav_gnss_bds* bds)
{
	if (bds == NULL)
		return;
	
	//configuration
	bds->cfg = NULL;
	bds->cfglength = 0;
	
	// satellites
	fsnav_free_gnss_sat(&(bds->sat), bds->max_sat_count);
	bds->max_sat_count = 0;
	
	// observation types
	fsnav_free_null((void**)(&(bds->obs_types)));
	bds->obs_count = 0;
	
	// gnss beidou structure
	free((void*)bds);
}